

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O2

void __thiscall leveldb::FilterBlockBuilder::GenerateFilter(FilterBlockBuilder *this)

{
  pointer puVar1;
  pointer pSVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong __new_size;
  bool bVar7;
  size_type local_20;
  
  lVar6 = (long)(this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (lVar6 == 0) {
    local_20 = CONCAT44(local_20._4_4_,(int)(this->result_)._M_string_length);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&this->filter_offsets_,(uint *)&local_20);
  }
  else {
    __new_size = lVar6 >> 3;
    local_20 = (this->keys_)._M_string_length;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&this->start_,&local_20);
    std::vector<leveldb::Slice,_std::allocator<leveldb::Slice>_>::resize
              (&this->tmp_keys_,__new_size);
    lVar6 = 0;
    uVar5 = __new_size;
    while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
      puVar1 = (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pSVar2 = (this->tmp_keys_).super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = *(long *)(lVar6 + (long)puVar1);
      lVar4 = *(long *)(lVar6 + 8 + (long)puVar1);
      *(pointer *)((long)&pSVar2->data_ + lVar6 * 2) = (this->keys_)._M_dataplus._M_p + lVar3;
      *(long *)((long)&pSVar2->size_ + lVar6 * 2) = lVar4 - lVar3;
      lVar6 = lVar6 + 8;
    }
    local_20 = CONCAT44(local_20._4_4_,(int)(this->result_)._M_string_length);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&this->filter_offsets_,(uint *)&local_20);
    (*this->policy_->_vptr_FilterPolicy[3])
              (this->policy_,
               (this->tmp_keys_).super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>
               ._M_impl.super__Vector_impl_data._M_start,__new_size & 0xffffffff,&this->result_);
    pSVar2 = (this->tmp_keys_).super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->tmp_keys_).super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>.
        _M_impl.super__Vector_impl_data._M_finish != pSVar2) {
      (this->tmp_keys_).super__Vector_base<leveldb::Slice,_std::allocator<leveldb::Slice>_>._M_impl.
      super__Vector_impl_data._M_finish = pSVar2;
    }
    (this->keys_)._M_string_length = 0;
    *(this->keys_)._M_dataplus._M_p = '\0';
    puVar1 = (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
  }
  return;
}

Assistant:

void FilterBlockBuilder::GenerateFilter() {
  const size_t num_keys = start_.size();
  if (num_keys == 0) {
    // Fast path if there are no keys for this filter
    filter_offsets_.push_back(result_.size());
    return;
  }

  // Make list of keys from flattened key structure
  start_.push_back(keys_.size());  // Simplify length computation
  tmp_keys_.resize(num_keys);
  for (size_t i = 0; i < num_keys; i++) {
    const char* base = keys_.data() + start_[i];
    size_t length = start_[i + 1] - start_[i];
    tmp_keys_[i] = Slice(base, length);
  }

  // Generate filter for current set of keys and append to result_.
  filter_offsets_.push_back(result_.size());
  policy_->CreateFilter(&tmp_keys_[0], static_cast<int>(num_keys), &result_);

  tmp_keys_.clear();
  keys_.clear();
  start_.clear();
}